

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miditime.cpp
# Opt level: O2

void processMidiFile(MidiFile *midifile)

{
  int iVar1;
  int iVar2;
  byte *pbVar3;
  pointer puVar4;
  int iVar5;
  MidiEventList *this;
  MidiEvent *pMVar6;
  ostream *poVar7;
  byte bVar8;
  int j;
  long lVar9;
  int index;
  double dVar10;
  
  smf::MidiFile::absoluteTicks(midifile);
  smf::MidiFile::joinTracks(midifile);
  index = 0;
  iVar5 = smf::MidiFile::getEventCount(midifile,0);
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  for (; index != iVar5; index = index + 1) {
    this = smf::MidiFile::operator[](midifile,0);
    pMVar6 = smf::MidiEventList::operator[](this,index);
    iVar1 = pMVar6->tick;
    iVar2 = pMVar6->track;
    dVar10 = smf::MidiFile::getTimeInSeconds(midifile,0,index);
    pbVar3 = (pMVar6->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>
             .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    bVar8 = *pbVar3 & 0xf0;
    if (((onsetQ == 0) || (bVar8 == 0x90)) &&
       ((onsetQ == 0 || ((bVar8 != 0x90 || (pbVar3[2] != 0)))))) {
      poVar7 = (ostream *)std::ostream::operator<<(&std::cout,iVar1);
      std::operator<<(poVar7,"\t");
      poVar7 = std::ostream::_M_insert<double>(dVar10);
      std::operator<<(poVar7,"\t");
      poVar7 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
      std::operator<<(poVar7,"\t");
      poVar7 = (ostream *)std::ostream::operator<<(&std::cout,index);
      std::operator<<(poVar7,"\t");
      for (lVar9 = 0;
          puVar4 = (pMVar6->super_MidiMessage).
                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,
          lVar9 < *(int *)&(pMVar6->super_MidiMessage).
                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish - (int)puVar4; lVar9 = lVar9 + 1) {
        if (lVar9 == 0) {
          poVar7 = std::operator<<((ostream *)&std::cout,"0x");
          *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
               *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 8;
          poVar7 = (ostream *)
                   std::ostream::operator<<
                             (poVar7,(uint)*(pMVar6->super_MidiMessage).
                                            super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                            .
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
          *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
               *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
        }
        else {
          poVar7 = (ostream *)std::ostream::operator<<(&std::cout,(uint)puVar4[lVar9]);
        }
        std::operator<<(poVar7," ");
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
  }
  return;
}

Assistant:

void processMidiFile(MidiFile& midifile) {
   midifile.absoluteTicks();
   midifile.joinTracks();
   int eventcount = midifile.getEventCount(0);
   MidiEvent *ptr;
   for (int i=0; i<eventcount; i++) {
      ptr = &(midifile[0][i]);
      int track       = ptr->track;
      int timeinticks = ptr->tick;
      double timeinsecs  = midifile.getTimeInSeconds(0, i);
      int attack = ((*ptr)[0] & 0xf0) == 0x90;
      if (onsetQ && !attack) {
         continue;
      }
      if (onsetQ && attack) {
         if ((*ptr)[2] == 0) {
            continue;
         }
      }
      
      cout << timeinticks << "\t";
      cout << timeinsecs << "\t";
      cout << track << "\t";
      cout << i << "\t";
      for (int j=0; j<(int)ptr->size(); j++) {
         if (j == 0) {
            cout << "0x" << hex << (int)(*ptr)[j] << dec << " ";
         } else {
            cout << (int)(*ptr)[j] << " ";
         }
      }
      cout << endl;
   }
}